

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O0

shared_ptr<boost::runtime::basic_param> * __thiscall
boost::shared_ptr<boost::runtime::basic_param>::operator=
          (shared_ptr<boost::runtime::basic_param> *this,shared_ptr<boost::runtime::basic_param> *r)

{
  shared_ptr<boost::runtime::basic_param> *in_RDI;
  shared_ptr<boost::runtime::basic_param> *in_stack_ffffffffffffffe0;
  
  shared_ptr(in_stack_ffffffffffffffe0,in_RDI);
  swap(in_stack_ffffffffffffffe0,in_RDI);
  ~shared_ptr((shared_ptr<boost::runtime::basic_param> *)0x29c4fe);
  return in_RDI;
}

Assistant:

shared_ptr & operator=( shared_ptr const & r ) BOOST_SP_NOEXCEPT
    {
        this_type(r).swap(*this);
        return *this;
    }